

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObjectEnumerator.cpp
# Opt level: O1

void __thiscall Js::ES5ArgumentsObjectEnumerator::Reset(ES5ArgumentsObjectEnumerator *this)

{
  (this->super_ArgumentsObjectPrefixEnumerator).formalArgIndex = 0xffffffff;
  (this->super_ArgumentsObjectPrefixEnumerator).doneFormalArgs = false;
  this->enumeratedFormalsInObjectArrayCount = 0;
  DynamicObject::GetEnumerator
            (&((this->super_ArgumentsObjectPrefixEnumerator).argumentsObject.ptr)->
              super_DynamicObject,&this->objectEnumerator,
             (this->super_ArgumentsObjectPrefixEnumerator).flags,
             (((((this->super_ArgumentsObjectPrefixEnumerator).super_JavascriptEnumerator.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,(EnumeratorCache *)0x0);
  return;
}

Assistant:

void ES5ArgumentsObjectEnumerator::Reset()
    {
        Init(nullptr);
    }